

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O1

int4 __thiscall PcodeOp::compareOrder(PcodeOp *this,PcodeOp *bop)

{
  uint uVar1;
  BlockBasic *pBVar2;
  
  if (this->parent == bop->parent) {
    uVar1 = -(uint)((this->start).order < (bop->start).order) | 1;
  }
  else {
    pBVar2 = (BlockBasic *)
             FlowBlock::findCommonBlock
                       (&this->parent->super_FlowBlock,&bop->parent->super_FlowBlock);
    if (pBVar2 == this->parent) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (uint)(pBVar2 == bop->parent);
    }
  }
  return uVar1;
}

Assistant:

int4 PcodeOp::compareOrder(const PcodeOp *bop) const

{
  if (parent == bop->parent)
    return (start.getOrder() < bop->start.getOrder()) ? -1 : 1;

  FlowBlock *common = FlowBlock::findCommonBlock(parent,bop->parent);
  if (common == parent)
    return -1;
  if (common == bop->parent)
    return 1;
  return 0;
}